

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::LoadImplicitLinkInfo(cmComputeLinkInformation *this)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string *psVar3;
  cmValue cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  pointer a;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  allocator<char> local_c9;
  string implicitDirVar;
  string implicitLibVar;
  cmList implicitDirs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmList implicitLibs;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&implicitLibVar,"CMAKE_PLATFORM_IMPLICIT_LINK_DIRECTORIES",
             (allocator<char> *)&local_68);
  psVar3 = (string *)cmMakefile::GetDefinition(pcVar1,&implicitLibVar);
  if (psVar3 == (string *)0x0) {
    psVar3 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&implicitDirVar,(string *)psVar3);
  init._M_len = 1;
  init._M_array = &implicitDirVar;
  cmList::cmList(&implicitDirs,init);
  std::__cxx11::string::~string((string *)&implicitDirVar);
  std::__cxx11::string::~string((string *)&implicitLibVar);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&implicitDirVar,"CMAKE_LIBRARY_ARCHITECTURE",
             (allocator<char> *)&implicitLibVar);
  cVar4 = cmMakefile::GetDefinition(pcVar1,&implicitDirVar);
  std::__cxx11::string::~string((string *)&implicitDirVar);
  pbVar5 = implicitDirs.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (cVar4.Value != (string *)0x0) {
    for (a = implicitDirs.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; a != pbVar5; a = a + 1) {
      implicitLibVar._M_dataplus._M_p._0_1_ = 0x2f;
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&implicitDirVar,a,(char *)&implicitLibVar,cVar4.Value);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->ImplicitLinkDirs,&implicitDirVar);
      std::__cxx11::string::~string((string *)&implicitDirVar);
    }
  }
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[27]>
            (&implicitDirVar,(char (*) [7])0x72bb95,&this->LinkLanguage,(char (*) [27])0x758a77);
  cVar4 = cmMakefile::GetDefinition(this->Makefile,&implicitDirVar);
  cmList::append_abi_cxx11_(&implicitDirs,cVar4,Yes,No);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->ImplicitLinkDirs,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )implicitDirs.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )implicitDirs.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[25]>
            (&implicitLibVar,(char (*) [7])0x72bb95,&this->LinkLanguage,
             (char (*) [25])"_IMPLICIT_LINK_LIBRARIES");
  psVar3 = (string *)cmMakefile::GetDefinition(this->Makefile,&implicitLibVar);
  if (psVar3 == (string *)0x0) {
    psVar3 = &cmValue::Empty_abi_cxx11_;
  }
  std::__cxx11::string::string((string *)&local_68,(string *)psVar3);
  init_00._M_len = 1;
  init_00._M_array = &local_68;
  cmList::cmList(&implicitLibs,init_00);
  std::__cxx11::string::~string((string *)&local_68);
  for (pbVar5 = implicitLibs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != implicitLibs.Values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    pcVar2 = (pbVar5->_M_dataplus)._M_p;
    if ((*pcVar2 != '-') || (pcVar2[1] == 'l')) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->ImplicitLinkLibs,pbVar5);
    }
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_PLATFORM_RUNTIME_PATH",&local_c9);
  cVar4 = cmMakefile::GetDefinition(pcVar1,&local_68);
  cmList::append(&this->RuntimeLinkDirs,cVar4,No);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitLibs.Values);
  std::__cxx11::string::~string((string *)&implicitLibVar);
  std::__cxx11::string::~string((string *)&implicitDirVar);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&implicitDirs.Values);
  return;
}

Assistant:

void cmComputeLinkInformation::LoadImplicitLinkInfo()
{
  // Get platform-wide implicit directories.
  cmList implicitDirs{ this->Makefile->GetDefinition(
    "CMAKE_PLATFORM_IMPLICIT_LINK_DIRECTORIES") };

  // Append library architecture to all implicit platform directories
  // and add them to the set
  if (cmValue libraryArch =
        this->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE")) {
    for (auto const& i : implicitDirs) {
      this->ImplicitLinkDirs.insert(cmStrCat(i, '/', *libraryArch));
    }
  }

  // Get language-specific implicit directories.
  std::string implicitDirVar =
    cmStrCat("CMAKE_", this->LinkLanguage, "_IMPLICIT_LINK_DIRECTORIES");
  implicitDirs.append(this->Makefile->GetDefinition(implicitDirVar));

  // Store implicit link directories.
  this->ImplicitLinkDirs.insert(implicitDirs.begin(), implicitDirs.end());

  // Get language-specific implicit libraries.
  std::string implicitLibVar =
    cmStrCat("CMAKE_", this->LinkLanguage, "_IMPLICIT_LINK_LIBRARIES");
  cmList implicitLibs{ this->Makefile->GetDefinition(implicitLibVar) };

  // Store implicit link libraries.
  for (auto const& item : implicitLibs) {
    // Items starting in '-' but not '-l' are flags, not libraries,
    // and should not be filtered by this implicit list.
    if (item[0] != '-' || item[1] == 'l') {
      this->ImplicitLinkLibs.insert(item);
    }
  }

  // Get platform specific rpath link directories
  cmList::append(this->RuntimeLinkDirs,
                 this->Makefile->GetDefinition("CMAKE_PLATFORM_RUNTIME_PATH"));
}